

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

Value * __thiscall
ot::commissioner::Interpreter::ProcessNetworkList
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  bool bVar1;
  bool bVar2;
  Status SVar3;
  Value *this_00;
  size_type sVar4;
  element_type *peVar5;
  reference aDomainName;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar6;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  string_view fmt_05;
  string_t local_bd8;
  Value local_bb8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_b70;
  int local_b60;
  anon_class_1_0_00000001 local_b5a;
  v10 local_b59;
  v10 *local_b58;
  size_t local_b50;
  string local_b48;
  Error local_b28;
  Value local_b00;
  allocator local_ab1;
  string local_ab0;
  string local_a90;
  reference local_a70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *alias_1;
  iterator __end4_1;
  iterator __begin4_1;
  StringArray *__range4_1;
  undefined1 local_a48 [7];
  RegistryStatus status_1;
  StringArray unresolved;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a28;
  char *local_a20;
  string local_a18;
  Error local_9f8;
  Value local_9d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_988;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *alias;
  iterator __end4;
  iterator __begin4;
  StringArray *__range4;
  v10 *local_960;
  size_t local_958;
  string local_950;
  Error local_930;
  Value local_908;
  Status local_8bc;
  anon_class_1_0_00000001 local_8ba;
  v10 local_8b9;
  RegistryStatus status;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_8b8;
  char *local_8b0;
  string local_8a8;
  Error local_888;
  Value local_860;
  anon_class_1_0_00000001 local_812;
  v10 local_811;
  v10 *local_810;
  size_t local_808;
  string local_800;
  Error local_7e0;
  Value local_7b8;
  anon_class_1_0_00000001 local_76a;
  v10 local_769;
  v10 *local_768;
  size_t local_760;
  string local_758;
  Error local_738;
  Value local_710;
  anon_class_1_0_00000001 local_6c2;
  v10 local_6c1;
  v10 *local_6c0;
  size_t local_6b8;
  string local_6b0;
  Error local_690;
  Value local_668;
  ErrorCode local_61c;
  Error local_618;
  Value local_5f0;
  undefined1 local_5a8 [8];
  json json;
  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  networks;
  undefined1 local_570 [8];
  Network nwk;
  Expression retExpr;
  Expression *aExpr_local;
  Interpreter *this_local;
  Value *value;
  undefined1 local_4c0 [16];
  v10 *local_4b0;
  ulong local_4a8;
  v10 *local_4a0;
  size_t sStack_498;
  string *local_490;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_488 [3];
  undefined1 local_470 [16];
  v10 *local_460;
  ulong local_458;
  v10 *local_450;
  size_t sStack_448;
  string *local_440;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_438 [3];
  undefined1 local_420 [16];
  v10 *local_410;
  ulong local_408;
  v10 *local_400;
  size_t sStack_3f8;
  string *local_3f0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_3e8 [3];
  undefined1 local_3d0 [16];
  v10 *local_3c0;
  ulong local_3b8;
  v10 *local_3b0;
  size_t sStack_3a8;
  string *local_3a0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_398 [3];
  undefined1 local_380 [16];
  v10 *local_370;
  ulong local_368;
  v10 *local_360;
  size_t sStack_358;
  string *local_350;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_348 [2];
  undefined1 local_338 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_328;
  char *local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_310;
  char *pcStack_308;
  string *local_300;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_2f8 [3];
  undefined1 local_2e0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2d0;
  char *local_2c8;
  reference local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2b8;
  char *pcStack_2b0;
  string *local_2a8;
  v10 *local_2a0;
  v10 **local_298;
  v10 *local_290;
  v10 **local_288;
  v10 *local_280;
  v10 **local_278;
  v10 *local_270;
  undefined1 *local_268;
  v10 *local_260;
  v10 **local_258;
  v10 *local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_248;
  v10 *local_240;
  v10 **local_238;
  v10 **local_230;
  v10 *local_228;
  size_t sStack_220;
  v10 **local_210;
  v10 *local_208;
  size_t sStack_200;
  v10 **local_1f0;
  v10 *local_1e8;
  size_t sStack_1e0;
  v10 **local_1d0;
  v10 *local_1c8;
  size_t sStack_1c0;
  v10 **local_1b0;
  v10 *local_1a8;
  size_t sStack_1a0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_190;
  undefined1 *local_188;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_180;
  undefined1 *local_178;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_170;
  undefined1 *local_168;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_160;
  undefined1 *local_158;
  Value **local_150;
  undefined1 *local_148;
  Value **local_140;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_138;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_130;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_128;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_120;
  Value **local_118;
  undefined8 local_110;
  undefined1 *local_108;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_100;
  undefined8 local_f8;
  undefined1 *local_f0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_e8;
  undefined8 local_e0;
  undefined1 *local_d8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_d0;
  undefined8 local_c8;
  undefined1 *local_c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_b8;
  undefined8 local_b0;
  undefined1 *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  char *pcStack_90;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_80;
  undefined1 *local_78;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_70;
  undefined8 local_68;
  undefined1 *local_60;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_58;
  undefined1 *local_50;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_48;
  undefined8 local_40;
  undefined1 *local_38;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  char *pcStack_10;
  
  bVar1 = false;
  Value::Value(__return_storage_ptr__);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&nwk.mCcm);
  persistent_storage::Network::Network((Network *)local_570);
  std::
  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ::vector((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            *)&json.m_value);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_5a8,(nullptr_t)0x0);
  ReParseMultiNetworkSyntax(&local_618,this,aExpr,(Expression *)&nwk.mCcm);
  Value::Value(&local_5f0,&local_618);
  this_00 = Value::operator=(__return_storage_ptr__,&local_5f0);
  local_61c = kNone;
  bVar2 = Value::operator!=(this_00,&local_61c);
  Value::~Value(&local_5f0);
  Error::~Error(&local_618);
  if (!bVar2) {
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&(this->mContext).mExportFiles);
    if (sVar4 < 2) {
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&(this->mContext).mImportFiles);
      if (sVar4 < 2) {
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)this);
        if ((sVar4 == 0) ||
           (sVar4 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(&(this->mContext).mDomAliases), sVar4 == 0)) {
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&(this->mContext).mDomAliases);
          if (sVar4 == 0) {
            sVar4 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)this);
            if (sVar4 == 0) {
              peVar5 = std::
                       __shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)&this->mRegistry);
              local_8bc = persistent_storage::Registry::GetAllNetworks
                                    (peVar5,(NetworkArray *)&json.m_value);
              if ((local_8bc != kSuccess) && (local_8bc != kNotFound)) {
                ProcessNetworkList::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)((long)&__range4 + 6));
                local_258 = &local_960;
                local_260 = (v10 *)((long)&__range4 + 7);
                bVar6 = ::fmt::v10::operator()(local_260);
                local_958 = bVar6.size_;
                local_960 = (v10 *)bVar6.data_;
                ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
                local_440 = &local_950;
                local_450 = local_960;
                sStack_448 = local_958;
                local_1d0 = &local_450;
                local_460 = local_960;
                local_458 = local_958;
                local_1c8 = local_460;
                sStack_1c0 = local_458;
                local_488[0] = ::fmt::v10::
                               make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                         ();
                local_158 = local_470;
                local_160 = local_488;
                local_f8 = 0;
                args_03.field_1.values_ = in_R9.values_;
                args_03.desc_ = (unsigned_long_long)local_160;
                fmt_03.size_ = 0;
                fmt_03.data_ = (char *)local_458;
                local_138 = local_160;
                local_100 = local_160;
                local_f0 = local_158;
                ::fmt::v10::vformat_abi_cxx11_(&local_950,local_460,fmt_03,args_03);
                Error::Error(&local_930,kNotFound,&local_950);
                Value::Value(&local_908,&local_930);
                Value::operator=(__return_storage_ptr__,&local_908);
                Value::~Value(&local_908);
                Error::~Error(&local_930);
                std::__cxx11::string::~string((string *)&local_950);
              }
            }
            else {
              __end4 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)this);
              alias = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)this);
              while (bVar2 = __gnu_cxx::operator!=
                                       (&__end4,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                 *)&alias), bVar2) {
                local_988 = __gnu_cxx::
                            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator*(&__end4);
                bVar2 = std::operator==(local_988,"all");
                if (((bVar2) || (bVar2 = std::operator==(local_988,"other"), bVar2)) &&
                   (sVar4 = std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)this), sVar4 != 1)) {
                  ProcessNetworkList::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)
                             ((long)&unresolved.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
                  local_248 = &local_a28;
                  local_250 = (v10 *)((long)&unresolved.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7)
                  ;
                  bVar6 = ::fmt::v10::operator()(local_250);
                  local_a20 = (char *)bVar6.size_;
                  local_a28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              bVar6.data_;
                  ::fmt::v10::detail::
                  check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                            ();
                  local_300 = &local_a18;
                  local_310 = local_a28;
                  pcStack_308 = local_a20;
                  local_318 = local_988;
                  local_a0 = &local_310;
                  local_328 = local_a28;
                  local_320 = local_a20;
                  local_98 = local_328;
                  pcStack_90 = local_320;
                  local_348[0] = ::fmt::v10::
                                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                                           ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                             *)local_988,(v10 *)local_300,local_a28);
                  local_50 = local_338;
                  local_58 = local_348;
                  local_40 = 0xd;
                  args_04.field_1.values_ = in_R9.values_;
                  args_04.desc_ = (unsigned_long_long)local_58;
                  fmt_04.size_ = 0xd;
                  fmt_04.data_ = local_320;
                  local_48 = local_58;
                  local_38 = local_50;
                  local_30 = local_58;
                  ::fmt::v10::vformat_abi_cxx11_(&local_a18,(v10 *)local_328,fmt_04,args_04);
                  Error::Error(&local_9f8,kInvalidArgs,&local_a18);
                  Value::Value(&local_9d0,&local_9f8);
                  Value::operator=(__return_storage_ptr__,&local_9d0);
                  Value::~Value(&local_9d0);
                  Error::~Error(&local_9f8);
                  std::__cxx11::string::~string((string *)&local_a18);
                  goto LAB_0014ae2e;
                }
                __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++(&__end4);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_a48);
              peVar5 = std::
                       __shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)&this->mRegistry);
              SVar3 = persistent_storage::Registry::GetNetworksByAliases
                                (peVar5,(StringArray *)this,(NetworkArray *)&json.m_value,
                                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_a48);
              __end4_1 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_a48);
              alias_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_a48);
              while (bVar2 = __gnu_cxx::operator!=
                                       (&__end4_1,
                                        (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&alias_1), bVar2) {
                local_a70 = __gnu_cxx::
                            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator*(&__end4_1);
                std::__cxx11::string::string((string *)&local_a90,(string *)local_a70);
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_ab0,"failed to resolve",&local_ab1);
                PrintNetworkMessage(this,&local_a90,&local_ab0,kYellow);
                std::__cxx11::string::~string((string *)&local_ab0);
                std::allocator<char>::~allocator((allocator<char> *)&local_ab1);
                std::__cxx11::string::~string((string *)&local_a90);
                __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++(&__end4_1);
              }
              if (SVar3 == kSuccess) {
                local_b60 = 0;
              }
              else {
                ProcessNetworkList::anon_class_1_0_00000001::operator()(&local_b5a);
                local_238 = &local_b58;
                local_240 = &local_b59;
                bVar6 = ::fmt::v10::operator()(local_240);
                local_b50 = bVar6.size_;
                local_b58 = (v10 *)bVar6.data_;
                ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
                local_490 = &local_b48;
                local_4a0 = local_b58;
                sStack_498 = local_b50;
                local_1b0 = &local_4a0;
                local_4b0 = local_b58;
                local_4a8 = local_b50;
                local_1a8 = local_4b0;
                sStack_1a0 = local_4a8;
                value = (Value *)::fmt::v10::
                                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                           ();
                local_148 = local_4c0;
                local_150 = &value;
                local_110 = 0;
                args_05.field_1.values_ = in_R9.values_;
                args_05.desc_ = (unsigned_long_long)local_150;
                fmt_05.size_ = 0;
                fmt_05.data_ = (char *)local_4a8;
                local_140 = local_150;
                local_118 = local_150;
                local_108 = local_148;
                ::fmt::v10::vformat_abi_cxx11_(&local_b48,local_4b0,fmt_05,args_05);
                Error::Error(&local_b28,kNotFound,&local_b48);
                Value::Value(&local_b00,&local_b28);
                Value::operator=(__return_storage_ptr__,&local_b00);
                Value::~Value(&local_b00);
                Error::~Error(&local_b28);
                std::__cxx11::string::~string((string *)&local_b48);
                local_b60 = 4;
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_a48);
              if (local_b60 != 0) {
                if (local_b60 != 4) goto LAB_0014ae61;
                goto LAB_0014ae2e;
              }
            }
          }
          else {
            peVar5 = std::
                     __shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&this->mRegistry);
            aDomainName = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[](&(this->mContext).mDomAliases,0);
            SVar3 = persistent_storage::Registry::GetNetworksInDomain
                              (peVar5,aDomainName,(NetworkArray *)&json.m_value);
            if (SVar3 != kSuccess) {
              ProcessNetworkList::anon_class_1_0_00000001::operator()(&local_8ba);
              local_268 = (undefined1 *)&stack0xfffffffffffff748;
              local_270 = &local_8b9;
              bVar6 = ::fmt::v10::operator()(local_270);
              local_8b0 = (char *)bVar6.size_;
              pbStack_8b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            bVar6.data_;
              ::fmt::v10::detail::
              check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                        ();
              local_2c0 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[](&(this->mContext).mDomAliases,0);
              local_2a8 = &local_8a8;
              local_2b8 = pbStack_8b8;
              pcStack_2b0 = local_8b0;
              local_20 = &local_2b8;
              local_2d0 = pbStack_8b8;
              local_2c8 = local_8b0;
              local_18 = local_2d0;
              pcStack_10 = local_2c8;
              local_2f8[0] = ::fmt::v10::
                             make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                                       ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)local_2c0,(v10 *)local_2a8,pbStack_8b8);
              local_78 = local_2e0;
              local_80 = local_2f8;
              local_68 = 0xd;
              args_02.field_1.values_ = in_R9.values_;
              args_02.desc_ = (unsigned_long_long)local_80;
              fmt_02.size_ = 0xd;
              fmt_02.data_ = local_2c8;
              local_70 = local_80;
              local_60 = local_78;
              local_28 = local_80;
              ::fmt::v10::vformat_abi_cxx11_(&local_8a8,(v10 *)local_2d0,fmt_02,args_02);
              Error::Error(&local_888,kNotFound,&local_8a8);
              Value::Value(&local_860,&local_888);
              Value::operator=(__return_storage_ptr__,&local_860);
              Value::~Value(&local_860);
              Error::~Error(&local_888);
              std::__cxx11::string::~string((string *)&local_8a8);
              goto LAB_0014ae2e;
            }
          }
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          basic_json<std::vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>_&,_std::vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>,_0>
                    (&local_b70,
                     (vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                      *)&json.m_value);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)local_5a8,&local_b70);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::~basic_json(&local_b70);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::dump(&local_bd8,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)local_5a8,4,' ',false,strict);
          Value::Value(&local_bb8,&local_bd8);
          Value::operator=(__return_storage_ptr__,&local_bb8);
          Value::~Value(&local_bb8);
          std::__cxx11::string::~string((string *)&local_bd8);
        }
        else {
          ProcessNetworkList::anon_class_1_0_00000001::operator()(&local_812);
          local_278 = &local_810;
          local_280 = &local_811;
          bVar6 = ::fmt::v10::operator()(local_280);
          local_808 = bVar6.size_;
          local_810 = (v10 *)bVar6.data_;
          ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
          local_3f0 = &local_800;
          local_400 = local_810;
          sStack_3f8 = local_808;
          local_1f0 = &local_400;
          local_410 = local_810;
          local_408 = local_808;
          local_1e8 = local_410;
          sStack_1e0 = local_408;
          local_438[0] = ::fmt::v10::
                         make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>()
          ;
          local_168 = local_420;
          local_170 = local_438;
          local_e0 = 0;
          args_01.field_1.values_ = in_R9.values_;
          args_01.desc_ = (unsigned_long_long)local_170;
          fmt_01.size_ = 0;
          fmt_01.data_ = (char *)local_408;
          local_130 = local_170;
          local_e8 = local_170;
          local_d8 = local_168;
          ::fmt::v10::vformat_abi_cxx11_(&local_800,local_410,fmt_01,args_01);
          Error::Error(&local_7e0,kInvalidArgs,&local_800);
          Value::Value(&local_7b8,&local_7e0);
          Value::operator=(__return_storage_ptr__,&local_7b8);
          Value::~Value(&local_7b8);
          Error::~Error(&local_7e0);
          std::__cxx11::string::~string((string *)&local_800);
        }
      }
      else {
        ProcessNetworkList::anon_class_1_0_00000001::operator()(&local_76a);
        local_288 = &local_768;
        local_290 = &local_769;
        bVar6 = ::fmt::v10::operator()(local_290);
        local_760 = bVar6.size_;
        local_768 = (v10 *)bVar6.data_;
        ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
        local_3a0 = &local_758;
        local_3b0 = local_768;
        sStack_3a8 = local_760;
        local_210 = &local_3b0;
        local_3c0 = local_768;
        local_3b8 = local_760;
        local_208 = local_3c0;
        sStack_200 = local_3b8;
        local_3e8[0] = ::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
        local_178 = local_3d0;
        local_180 = local_3e8;
        local_c8 = 0;
        args_00.field_1.values_ = in_R9.values_;
        args_00.desc_ = (unsigned_long_long)local_180;
        fmt_00.size_ = 0;
        fmt_00.data_ = (char *)local_3b8;
        local_128 = local_180;
        local_d0 = local_180;
        local_c0 = local_178;
        ::fmt::v10::vformat_abi_cxx11_(&local_758,local_3c0,fmt_00,args_00);
        Error::Error(&local_738,kInvalidArgs,&local_758);
        Value::Value(&local_710,&local_738);
        Value::operator=(__return_storage_ptr__,&local_710);
        Value::~Value(&local_710);
        Error::~Error(&local_738);
        std::__cxx11::string::~string((string *)&local_758);
      }
    }
    else {
      ProcessNetworkList::anon_class_1_0_00000001::operator()(&local_6c2);
      local_298 = &local_6c0;
      local_2a0 = &local_6c1;
      bVar6 = ::fmt::v10::operator()(local_2a0);
      local_6b8 = bVar6.size_;
      local_6c0 = (v10 *)bVar6.data_;
      ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
      local_350 = &local_6b0;
      local_360 = local_6c0;
      sStack_358 = local_6b8;
      local_230 = &local_360;
      local_370 = local_6c0;
      local_368 = local_6b8;
      local_228 = local_370;
      sStack_220 = local_368;
      local_398[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
      local_188 = local_380;
      local_190 = local_398;
      local_b0 = 0;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)local_190;
      fmt.size_ = 0;
      fmt.data_ = (char *)local_368;
      local_120 = local_190;
      local_b8 = local_190;
      local_a8 = local_188;
      ::fmt::v10::vformat_abi_cxx11_(&local_6b0,local_370,fmt,args);
      Error::Error(&local_690,kInvalidArgs,&local_6b0);
      Value::Value(&local_668,&local_690);
      Value::operator=(__return_storage_ptr__,&local_668);
      Value::~Value(&local_668);
      Error::~Error(&local_690);
      std::__cxx11::string::~string((string *)&local_6b0);
    }
  }
LAB_0014ae2e:
  bVar1 = true;
  local_b60 = 1;
LAB_0014ae61:
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)local_5a8);
  std::
  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ::~vector((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
             *)&json.m_value);
  persistent_storage::Network::~Network((Network *)local_570);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&nwk.mCcm);
  if (!bVar1) {
    Value::~Value(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessNetworkList(const Expression &aExpr)
{
    using namespace ot::commissioner::persistent_storage;

    Interpreter::Value   value;
    Expression           retExpr;
    Network              nwk{};
    std::vector<Network> networks;
    ::nlohmann::json     json;

    SuccessOrExit(value = ReParseMultiNetworkSyntax(aExpr, retExpr));
    // export file specification must be single or omitted
    VerifyOrExit(mContext.mExportFiles.size() < 2, value = ERROR_INVALID_ARGS(SYNTAX_MULTI_EXPORT));
    // import file specification must be single or omitted
    VerifyOrExit(mContext.mImportFiles.size() < 2, value = ERROR_INVALID_ARGS(SYNTAX_MULTI_IMPORT));
    // network and domain must not be specified simultaneously
    VerifyOrExit(mContext.mNwkAliases.size() == 0 || mContext.mDomAliases.size() == 0,
                 value = ERROR_INVALID_ARGS(SYNTAX_NWK_DOM_MUTUAL));

    if (mContext.mDomAliases.size() > 0)
    {
        VerifyOrExit(mRegistry->GetNetworksInDomain(mContext.mDomAliases[0], networks) == RegistryStatus::kSuccess,
                     value = ERROR_NOT_FOUND("failed to find networks in domain '{}'", mContext.mDomAliases[0]));
    }
    else if (mContext.mNwkAliases.size() == 0)
    {
        RegistryStatus status = mRegistry->GetAllNetworks(networks);
        if (status != RegistryStatus::kSuccess && status != RegistryStatus::kNotFound)
        {
            value = ERROR_NOT_FOUND(NOT_FOUND_STR NETWORK_STR);
        }
    }
    else
    {
        // Quickly check group aliases
        for (const auto &alias : mContext.mNwkAliases)
        {
            if (alias == ALIAS_ALL || alias == ALIAS_OTHERS)
                VerifyOrExit(mContext.mNwkAliases.size() == 1, value = ERROR_INVALID_ARGS(SYNTAX_GROUP_ALIAS, alias));
        }

        StringArray    unresolved;
        RegistryStatus status = mRegistry->GetNetworksByAliases(mContext.mNwkAliases, networks, unresolved);
        for (const auto &alias : unresolved)
        {
            PrintNetworkMessage(alias, RUNTIME_RESOLVING_FAILED, COLOR_ALIAS_FAILED);
        }
        VerifyOrExit(status == RegistryStatus::kSuccess, value = ERROR_NOT_FOUND(NOT_FOUND_STR NETWORK_STR));
    }

    json  = networks;
    value = json.dump(JSON_INDENT_DEFAULT);

exit:
    return value;
}